

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O1

bool mg::data::nxcx_decompress(Nxx *header,uint8_t *data,string *out)

{
  uint uVar1;
  uint8_t *puStack_98;
  z_stream istream;
  
  std::__cxx11::string::resize((ulong)out,(char)header->size);
  istream.data_type = 0;
  istream._92_4_ = 0;
  istream.adler = 0;
  istream.zfree = (free_func)0x0;
  istream.opaque = (voidpf)0x0;
  istream.state = (internal_state *)0x0;
  istream.zalloc = (alloc_func)0x0;
  istream.total_out = 0;
  istream.msg = (char *)0x0;
  istream.avail_in = 0;
  istream._12_4_ = 0;
  istream.next_in = (Bytef *)(ulong)header->compressed_size;
  istream.next_out = (Bytef *)(ulong)header->size;
  istream.total_in = (uLong)(out->_M_dataplus)._M_p;
  istream.avail_out = 0;
  istream._36_4_ = 0;
  puStack_98 = data;
  inflateInit_(&puStack_98,"1.2.11",0x70);
  uVar1 = inflate(&puStack_98,4);
  if (uVar1 < 2) {
    uVar1 = inflateEnd(&puStack_98);
    if (uVar1 == 0) {
      return uVar1 == 0;
    }
  }
  fprintf(_stderr,"zlib error: %d: %s\n",(ulong)uVar1,istream.total_out);
  return false;
}

Assistant:

bool nxcx_decompress(const Nxx &header, const uint8_t *data, std::string &out) {
  // Expand output to hold data
  out.resize(header.size);

  // Create inflate stream
  z_stream istream{};
  istream.avail_in = header.compressed_size;
  istream.next_in = const_cast<uint8_t *>(data);
  istream.avail_out = header.size;
  istream.next_out = reinterpret_cast<uint8_t *>(out.data());
  istream.total_out = 0;

  // Perform inflation
  inflateInit(&istream);
  const int err = inflate(&istream, Z_FINISH);
  if (err != Z_STREAM_END && err != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }
  const int err2 = inflateEnd(&istream);
  if (err2 != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err2, istream.msg);
    return false;
  }

  return true;
}